

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

UniValue * __thiscall UniValue::find_value(UniValue *this,string_view key)

{
  long lVar1;
  pointer pbVar2;
  pointer pUVar3;
  bool bVar4;
  int iVar5;
  UniValue *pUVar6;
  ulong uVar7;
  long lVar8;
  size_t __n;
  size_type __rlen;
  ulong uVar9;
  long in_FS_OFFSET;
  
  __n = key._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar6 = &NullUniValue;
  lVar8 = (long)(this->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (lVar8 != 0) {
    uVar9 = 0;
    uVar7 = 1;
    do {
      if (pbVar2[uVar9]._M_string_length == __n) {
        if (__n != 0) {
          iVar5 = bcmp(key._M_str,pbVar2[uVar9]._M_dataplus._M_p,__n);
          if (iVar5 != 0) goto LAB_00dc93f1;
        }
        pUVar3 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 3) *
                0x2e8ba2e8ba2e8ba3;
        if (uVar9 <= uVar7 && uVar7 - uVar9 != 0) {
          pUVar6 = pUVar3 + uVar9;
          goto LAB_00dc9433;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9);
        }
        goto LAB_00dc9473;
      }
LAB_00dc93f1:
      bVar4 = uVar7 < (ulong)(lVar8 >> 5);
      uVar9 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
    pUVar6 = &NullUniValue;
  }
LAB_00dc9433:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pUVar6;
  }
LAB_00dc9473:
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::find_value(std::string_view key) const
{
    for (unsigned int i = 0; i < keys.size(); ++i) {
        if (keys[i] == key) {
            return values.at(i);
        }
    }
    return NullUniValue;
}